

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UsageDisplacementTestCase::testPolygonOffset
          (UsageDisplacementTestCase *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  TextureFormat log;
  RenderContext *pRVar3;
  TestContext *testCtx;
  UsageDisplacementTestCase *pUVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  deBool dVar8;
  undefined4 extraout_var;
  TestError *this_00;
  float fVar10;
  long lVar11;
  void *pvVar12;
  float fVar13;
  Vec4 triangle [3];
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  float local_334 [3];
  undefined1 local_328 [8];
  float afStack_320 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  Surface local_2f0;
  Surface local_2d8;
  UsageDisplacementTestCase *local_2c0;
  value_type local_2b8;
  undefined1 local_298 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280 [4];
  ios_base local_220 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_208;
  undefined1 local_1e8 [208];
  deRandom local_118;
  ShaderProgram local_108;
  long lVar9;
  
  deRandom_init(&local_118,0xdec0de);
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_2d8,iVar5,iVar5);
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_2f0,iVar5,iVar5);
  iVar5 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_328 = (undefined1  [8])&local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",""
            );
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298,0,0xac);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8[8] = 0;
  local_1e8._9_7_ = 0;
  local_1e8[0x10] = 0;
  local_1e8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298,(value_type *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_280,&local_2b8);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar3,(ProgramSources *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_208);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328,local_318._M_allocated_capacity + 1);
  }
  local_2c0 = this;
  uVar6 = (**(code **)(lVar9 + 0x780))(local_108.m_program.m_program,"a_position");
  uVar7 = (**(code **)(lVar9 + 0x780))(local_108.m_program.m_program,"a_color");
  if (local_108.m_program.m_info.linkOk != false) {
    (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar9 + 0x1d0))(0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4100);
    (**(code **)(lVar9 + 0x1a00))(0,0,(local_2c0->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar9 + 0x1680))(local_108.m_program.m_program);
    (**(code **)(lVar9 + 0x5e0))(0xb71);
    (**(code **)(lVar9 + 0x5e0))(0x8037);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar7);
    poVar1 = (ostringstream *)(local_298 + 8);
    local_298._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Framebuffer cleared, clear color = Black.",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_220);
    poVar1 = (ostringstream *)(local_298 + 8);
    local_298._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_220);
    poVar1 = (ostringstream *)(local_298 + 8);
    fVar10 = 0.0;
    do {
      local_334[0] = fVar10;
      dVar8 = deRandom_getBool(&local_118);
      local_308 = 0;
      uStack_300 = 0;
      local_318._M_allocated_capacity = 0;
      local_318._8_8_ = 0;
      local_328._0_4_ = R;
      local_328._4_4_ = SNORM_INT8;
      afStack_320[0] = 0.0;
      afStack_320[1] = 0.0;
      fVar10 = *(float *)(&DAT_019ec5c0 + (ulong)(dVar8 == 1) * 4);
      lVar11 = 0xc;
      do {
        fVar13 = deRandom_getFloat(&local_118);
        local_334[2] = fVar13 + fVar13 + -1.0;
        local_334[1] = deRandom_getFloat(&local_118);
        fVar13 = deRandom_getFloat(&local_118);
        *(float *)((long)local_334 + lVar11) = local_334[2];
        *(float *)((long)local_334 + lVar11 + 4) = local_334[1] + local_334[1] + -1.0;
        *(undefined4 *)((long)local_334 + lVar11 + 8) = 0x3f000000;
        *(float *)(local_328 + lVar11) = fVar13 + 1.0;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x3c);
      (**(code **)(lVar9 + 0x19f0))(uVar6,4,0x1406,0,0,local_328);
      local_298._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_298 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 8),"Setup triangle with random coordinates:",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_298 + 8));
      std::ios_base::~ios_base(local_220);
      lVar11 = 0xc;
      do {
        local_298._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_334 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_334 + lVar11 + 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
        std::ostream::_M_insert<double>((double)*(float *)((long)local_334 + lVar11 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
        std::ostream::_M_insert<double>((double)*(float *)(local_328 + lVar11));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_220);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x3c);
      poVar2 = (ostringstream *)(local_298 + 8);
      local_298._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0).",0x4b
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_220);
      (**(code **)(lVar9 + 0x4a0))(0x207);
      (**(code **)(lVar9 + 0x1028))(0,0);
      (**(code **)(lVar9 + 0x238))(0,0,0,0);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      poVar2 = (ostringstream *)(local_298 + 8);
      local_298._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, ",0x43);
      std::ostream::_M_insert<double>((double)fVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_220);
      (**(code **)(lVar9 + 0x4a0))(0x202);
      (**(code **)(lVar9 + 0x1028))(0,fVar10);
      (**(code **)(lVar9 + 0x238))(1,1,1,1);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      local_298._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_298 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      fVar10 = local_334[0];
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_298 + 8));
      std::ios_base::~ios_base(local_220);
      fVar10 = (float)((int)fVar10 + 1);
    } while (fVar10 != 5.60519e-44);
    (**(code **)(lVar9 + 0x518))(uVar6);
    (**(code **)(lVar9 + 0x1680))(0);
    (**(code **)(lVar9 + 0x648))();
    pUVar4 = local_2c0;
    pRVar3 = ((local_2c0->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    pvVar12 = (void *)local_2d8.m_pixels.m_cap;
    if ((void *)local_2d8.m_pixels.m_cap != (void *)0x0) {
      pvVar12 = local_2d8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_298,(TextureFormat *)local_328,local_2d8.m_width,
               local_2d8.m_height,1,pvVar12);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_298);
    glu::ShaderProgram::~ShaderProgram(&local_108);
    poVar1 = (ostringstream *)(local_298 + 8);
    local_298._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting black framebuffer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_220);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    pvVar12 = (void *)local_2f0.m_pixels.m_cap;
    if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
      pvVar12 = local_2f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_298,(TextureFormat *)&local_108,local_2f0.m_width,
               local_2f0.m_height,1,pvVar12);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_298,(Vec4 *)&local_108);
    testCtx = (pUVar4->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar3 = ((pUVar4->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    if ((void *)local_2d8.m_pixels.m_cap != (void *)0x0) {
      local_2d8.m_pixels.m_cap = (size_t)local_2d8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_298,(TextureFormat *)&local_108,local_2d8.m_width,
               local_2d8.m_height,1,(void *)local_2d8.m_pixels.m_cap);
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
      local_2f0.m_pixels.m_cap = (size_t)local_2f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_108,(TextureFormat *)local_328,local_2f0.m_width,
               local_2f0.m_height,1,(void *)local_2f0.m_pixels.m_cap);
    verifyImages((TestLog *)log,testCtx,pRVar3,(ConstPixelBufferAccess *)local_298,
                 (ConstPixelBufferAccess *)&local_108);
    tcu::Surface::~Surface(&local_2f0);
    tcu::Surface::~Surface(&local_2d8);
    return;
  }
  glu::operator<<((TestLog *)log,&local_108);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x1f8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsageDisplacementTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	de::Random			rnd				(0xdec0de);
	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");
		const int					numIterations	= 40;

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// draw colorless (mask = 0,0,0) triangle at random* location, set offset and render green triangle with depthfunc = equal
		// *) w >= 1.0 and z in (-1, 1) range
		for (int iterationNdx = 0; iterationNdx < numIterations; ++iterationNdx)
		{
			const bool		offsetDirection = rnd.getBool();
			const float		offset = offsetDirection ? -1.0f : 1.0f;
			tcu::Vec4		triangle[3];

			for (int vertexNdx = 0; vertexNdx < DE_LENGTH_OF_ARRAY(triangle); ++vertexNdx)
				triangle[vertexNdx] = genRandomVec4(rnd);

			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Setup triangle with random coordinates:" << TestLog::EndMessage;
			for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
				log << TestLog::Message
						<< "\tx=" << triangle[ndx].x()
						<< "\ty=" << triangle[ndx].y()
						<< "\tz=" << triangle[ndx].z()
						<< "\tw=" << triangle[ndx].w()
						<< TestLog::EndMessage;

			log << TestLog::Message << "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.colorMask				(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			// all fragments should have different Z => DepthFunc == GL_EQUAL fails with every fragment

			log << TestLog::Message << "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, " << offset << ")." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(0, offset);
			gl.colorMask				(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << TestLog::EndMessage; // empty line for clarity
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}